

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

void CConsole::ConToggleStroke(IResult *pResult,void *pUser)

{
  int iVar1;
  uint uVar2;
  CChain *pChainInfo;
  undefined4 extraout_var;
  CCommand *pCVar3;
  void **ppvVar4;
  undefined8 uVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  FCommandCallback p_Var6;
  char *format;
  long in_FS_OFFSET;
  char aBuf [128];
  ulong local_a8 [17];
  long local_20;
  undefined4 extraout_var_00;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,1);
  pCVar3 = FindCommand((CConsole *)pUser,(char *)CONCAT44(extraout_var,iVar1),
                       *(int *)((long)pUser + 0x10));
  if (pCVar3 == (CCommand *)0x0) {
    iVar1 = (*pResult->_vptr_IResult[4])(pResult,1);
    uVar5 = CONCAT44(extraout_var_01,iVar1);
    format = "No such command: \'%s\'.";
  }
  else {
    p_Var6 = pCVar3->m_pfnCallback;
    if (p_Var6 == Con_Chain) {
      ppvVar4 = &pCVar3->m_pUserData;
      do {
        p_Var6 = *(FCommandCallback *)((long)*ppvVar4 + 8);
        ppvVar4 = (void **)((long)*ppvVar4 + 0x10);
      } while (p_Var6 == Con_Chain);
    }
    if (p_Var6 == IntVariableCommand) {
      iVar1 = (*pResult->_vptr_IResult[2])(pResult,0);
      uVar2 = (*pResult->_vptr_IResult[2])(pResult,(ulong)((iVar1 == 0) + 2));
      iVar1 = (*pResult->_vptr_IResult[4])(pResult,1);
      str_format((char *)local_a8,0x80,"%s %i",CONCAT44(extraout_var_02,iVar1),(ulong)uVar2);
      (**(code **)(*pUser + 0x98))(pUser,local_a8);
      local_a8[0] = local_a8[0] & 0xffffffffffffff00;
      goto LAB_001ba6b6;
    }
    iVar1 = (*pResult->_vptr_IResult[4])(pResult,1);
    uVar5 = CONCAT44(extraout_var_00,iVar1);
    format = "Invalid command: \'%s\'.";
  }
  str_format((char *)local_a8,0x80,format,uVar5);
LAB_001ba6b6:
  if ((char)local_a8[0] != '\0') {
    (**(code **)(*pUser + 200))(pUser,0,"console",local_a8,0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CConsole::ConToggleStroke(IConsole::IResult *pResult, void *pUser)
{
	CConsole *pConsole = static_cast<CConsole *>(pUser);
	char aBuf[128] = {0};
	CCommand *pCommand = pConsole->FindCommand(pResult->GetString(1), pConsole->m_FlagMask);
	if(pCommand)
	{
		FCommandCallback pfnCallback = pCommand->m_pfnCallback;
		void *pUserData = pCommand->m_pUserData;
		pConsole->TraverseChain(&pfnCallback, &pUserData);
		if(pfnCallback == IntVariableCommand)
		{
			int Val = pResult->GetInteger(0)==0 ? pResult->GetInteger(3) : pResult->GetInteger(2);
			str_format(aBuf, sizeof(aBuf), "%s %i", pResult->GetString(1), Val);
			pConsole->ExecuteLine(aBuf);
			aBuf[0] = 0;
		}
		else
			str_format(aBuf, sizeof(aBuf), "Invalid command: '%s'.", pResult->GetString(1));
	}
	else
		str_format(aBuf, sizeof(aBuf), "No such command: '%s'.", pResult->GetString(1));

	if(aBuf[0])
		pConsole->Print(OUTPUT_LEVEL_STANDARD, "console", aBuf);
}